

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_api.c
# Opt level: O1

MPP_RET hal_avs2d_init(void *hal,MppHalCfg *cfg)

{
  MppDecCfgSet *pMVar1;
  RK_U32 RVar2;
  MPP_RET MVar3;
  MppDecHwCap *pMVar4;
  undefined8 uVar5;
  MppHalApi *pMVar6;
  
  if ((avs2d_hal_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_avs2d_api","In.","hal_avs2d_init");
  }
  if (hal == (void *)0x0) {
    MVar3 = MPP_ERR_INIT;
    if (((byte)avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_api","input empty(%d).\n",(char *)0x0,0x4f);
    }
LAB_001e72e1:
    if ((avs2d_hal_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"hal_avs2d_api","Out.","hal_avs2d_init");
    }
  }
  else {
    mpp_env_get_u32("avs2d_debug",&avs2d_hal_debug,0);
    memset(hal,0,0x5d0);
    RVar2 = mpp_get_client_hw_id(9);
    if (RVar2 == 0x70393f05) {
      pMVar6 = &hal_avs2d_vdpu382;
    }
    else {
      pMVar6 = &hal_avs2d_rkvdpu;
    }
    if (RVar2 == 0x38321746) {
      pMVar6 = &hal_avs2d_vdpu383;
    }
    MVar3 = mpp_dev_init(&cfg->dev,VPU_CLIENT_RKVDEC);
    if (MVar3 != MPP_OK) {
      _mpp_log_l(2,"hal_avs2d_api","mpp_dev_init failed. ret: %d\n",(char *)0x0,(ulong)(uint)MVar3);
      return MVar3;
    }
    pMVar4 = mpp_get_dec_hw_info_by_client_type(VPU_CLIENT_RKVDEC);
    cfg->hw_info = pMVar4;
    *(MppDecHwCap **)((long)hal + 0x5c8) = pMVar4;
    cfg->support_fast_mode = 1;
    pMVar1 = cfg->cfg;
    *(MppDecCfgSet **)((long)hal + 8) = pMVar1;
    *(MppDev *)((long)hal + 0x40) = cfg->dev;
    *(MppCbCtx **)((long)hal + 0x38) = cfg->dec_cb;
    *(MppBufSlots *)((long)hal + 0x10) = cfg->frame_slots;
    *(MppBufSlots *)((long)hal + 0x18) = cfg->packet_slots;
    *(uint *)((long)hal + 0x5a0) = (uint)((pMVar1->base).fast_parse != 0);
    if ((*(long *)((long)hal + 0x20) == 0) &&
       (MVar3 = mpp_buffer_group_get
                          ((MppBufferGroup *)((long)hal + 0x20),MPP_BUFFER_TYPE_ION,
                           MPP_BUFFER_INTERNAL,"hal_avs2d_api","hal_avs2d_init"), MVar3 < MPP_OK)) {
      uVar5 = 0x77;
    }
    else {
      MVar3 = (*pMVar6->init)(hal,cfg);
      if (MPP_NOK < MVar3) {
        *(MppHalApi **)hal = pMVar6;
        goto LAB_001e72e1;
      }
      uVar5 = 0x7a;
    }
    if (((byte)avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_api","Function error(%d).\n",(char *)0x0,uVar5);
    }
    hal_avs2d_deinit(hal);
  }
  return MVar3;
}

Assistant:

MPP_RET hal_avs2d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    Avs2dHalCtx_t *p_hal = NULL;
    const MppHalApi *api;

    AVS2D_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == hal);

    mpp_env_get_u32("avs2d_debug", &avs2d_hal_debug, 0);

    p_hal = (Avs2dHalCtx_t *)hal;
    memset(p_hal, 0, sizeof(Avs2dHalCtx_t));


    RK_U32 hw_id = mpp_get_client_hw_id(VPU_CLIENT_RKVDEC);

    switch (hw_id) {
    case HWID_VDPU383 : {
        api = &hal_avs2d_vdpu383;
    } break;
    case HWID_VDPU382_RK3528 : {
        api = &hal_avs2d_vdpu382;
    } break;
    default : {
        api = &hal_avs2d_rkvdpu;
    } break;
    }

    ret = mpp_dev_init(&cfg->dev, VPU_CLIENT_RKVDEC);
    if (ret) {
        mpp_err("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }
    cfg->hw_info = mpp_get_dec_hw_info_by_client_type(VPU_CLIENT_RKVDEC);
    p_hal->hw_info = cfg->hw_info;
    cfg->support_fast_mode = 1;

    p_hal->cfg = cfg->cfg;
    p_hal->dev = cfg->dev;
    p_hal->dec_cb = cfg->dec_cb;
    p_hal->frame_slots  = cfg->frame_slots;
    p_hal->packet_slots = cfg->packet_slots;
    p_hal->fast_mode    = cfg->cfg->base.fast_parse && cfg->support_fast_mode;

    //< get buffer group
    if (p_hal->buf_group == NULL)
        FUN_CHECK(ret = mpp_buffer_group_get_internal(&p_hal->buf_group, MPP_BUFFER_TYPE_ION));

    //!< run init funtion
    FUN_CHECK(ret = api->init(hal, cfg));

    p_hal->hal_api = api;

__RETURN:
    AVS2D_HAL_TRACE("Out.");
    return ret;
__FAILED:
    hal_avs2d_deinit(hal);
    return ret;
}